

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

void raviX_set_remove(Set *set,void *key)

{
  SetEntry *entry_00;
  SetEntry *entry;
  void *key_local;
  Set *set_local;
  
  entry_00 = raviX_set_search(set,key);
  raviX_set_remove_entry(set,entry_00);
  return;
}

Assistant:

void raviX_set_remove(Set *set, const void *key)
{
	SetEntry *entry;

	entry = raviX_set_search(set, key);

	raviX_set_remove_entry(set, entry);
}